

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actor.h
# Opt level: O0

DVector2 __thiscall AActor::Vec2Offset(AActor *this,double dx,double dy,bool absolute)

{
  AActor *this_00;
  byte in_DL;
  undefined7 in_register_00000031;
  double dVar1;
  double dVar2;
  double extraout_XMM0_Qa;
  DVector2 DVar3;
  bool absolute_local;
  double dy_local;
  double dx_local;
  AActor *this_local;
  
  this_00 = (AActor *)CONCAT71(in_register_00000031,absolute);
  if ((in_DL & 1) == 0) {
    dVar1 = X(this_00);
    dVar2 = Y(this_00);
    DVar3 = P_GetOffsetPosition(dVar1,dVar2,dx,dy);
  }
  else {
    dVar1 = X(this_00);
    dVar2 = Y(this_00);
    dVar2 = dVar2 + dy;
    TVector2<double>::TVector2((TVector2<double> *)this,dVar1 + dx,dVar2);
    DVar3.Y = dVar2;
    DVar3.X = extraout_XMM0_Qa;
  }
  return DVar3;
}

Assistant:

DVector2 Vec2Offset(double dx, double dy, bool absolute = false)
	{
		if (absolute)
		{
			return { X() + dx, Y() + dy };
		}
		else
		{
			return P_GetOffsetPosition(X(), Y(), dx, dy);
		}
	}